

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model_cleanModel_Test::Model_cleanModel_Test(Model_cleanModel_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00134930;
  return;
}

Assistant:

TEST(Model, cleanModel)
{
    // Make a model with empty components and empty import sources.
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"dirtyModel\">\n"
        "  <units name=\"namedEmptyUnits\"/>\n"
        "  <units id=\"nonEmptyId\"/>\n"
        "  <component name=\"namedEmptyComponent\"/>\n"
        "  <component name=\"nonEmptyComponent\">\n"
        "    <variable name=\"x\" units=\"requiredUnits\"/>\n"
        "  </component>\n"
        "  <component id=\"nonEmptyComponentId\"/>\n"
        "</model>\n";
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("dirty_model.cellml"));
    auto printer = libcellml::Printer::create();

    EXPECT_EQ(size_t(4), model->componentCount());
    EXPECT_EQ(size_t(3), model->unitsCount());

    // Call the Model::clean() function to remove empty components and units.
    model->clean();

    EXPECT_EQ(size_t(3), model->componentCount());
    EXPECT_EQ(size_t(2), model->unitsCount());
    EXPECT_EQ(e, printer->printModel(model));
}